

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

uint32_t gen_prep_dbgex(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 t;
  uintptr_t o;
  
  if ((ctx->flags & 0x100) == 0) {
    return 0x44;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->singlestep_enabled;
  t = tcg_temp_new_i64(tcg_ctx);
  gen_load_spr(tcg_ctx,t,0x130);
  tcg_gen_ori_i64_ppc64(tcg_ctx,t,t,(ulong)((uVar1 & 1) << 0x1a) + 0x4000000);
  gen_store_spr(tcg_ctx,0x130,t);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return 0xf;
}

Assistant:

static uint32_t gen_prep_dbgex(DisasContext *ctx)
{
    if (ctx->flags & POWERPC_FLAG_DE) {
        TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
        target_ulong dbsr = 0;
        if (ctx->singlestep_enabled & CPU_SINGLE_STEP) {
            dbsr = DBCR0_ICMP;
        } else {
            /* Must have been branch */
            dbsr = DBCR0_BRT;
        }
        TCGv t0 = tcg_temp_new(tcg_ctx);
        gen_load_spr(tcg_ctx, t0, SPR_BOOKE_DBSR);
        tcg_gen_ori_tl(tcg_ctx, t0, t0, dbsr);
        gen_store_spr(tcg_ctx, SPR_BOOKE_DBSR, t0);
        tcg_temp_free(tcg_ctx, t0);
        return POWERPC_EXCP_DEBUG;
    } else {
        return POWERPC_EXCP_TRACE;
    }
}